

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_privileged.inc.c
# Opt level: O3

_Bool trans_hfence_bvma(DisasContext_conflict12 *ctx,arg_sfence_vma *a)

{
  TCGContext_conflict11 *tcg_ctx;
  TCGTemp *args [1];
  TCGTemp *local_8;
  
  if ((0x10fff < ctx->priv_ver) && ((ctx->misa & 0x80) != 0)) {
    tcg_ctx = ctx->uc->tcg_ctx;
    local_8 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_riscv64(tcg_ctx,helper_tlb_flush_riscv64,(TCGTemp *)0x0,1,&local_8);
    return true;
  }
  return false;
}

Assistant:

static bool trans_hfence_bvma(DisasContext *ctx, arg_sfence_vma *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->priv_ver >= PRIV_VERSION_1_10_0 &&
        has_ext(ctx, RVH)) {
        /* Hpervisor extensions exist */
        /*
         * if (env->priv == PRV_M ||
         *   (env->priv == PRV_S &&
         *    !riscv_cpu_virt_enabled(env) &&
         *    get_field(ctx->mstatus_fs, MSTATUS_TVM))) {
         */
            gen_helper_tlb_flush(tcg_ctx, tcg_ctx->cpu_env);
            return true;
        /* } */
    }
    return false;
}